

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O3

void __thiscall CompoundFile::File::initialize(File *this,string *fileName)

{
  Header *this_00;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar3;
  istream *stream_00;
  pointer pSVar4;
  pointer pSVar5;
  pointer pcVar6;
  mapped_type *pmVar7;
  Exception *this_01;
  Stream stream;
  MSAT msat;
  Directory local_1a0;
  int32_t local_164;
  Directory local_160;
  undefined1 local_128 [8];
  pointer pSStack_120;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_118;
  pointer local_100;
  pointer local_f8;
  pointer local_e8;
  pointer local_b8;
  pointer local_a8;
  MSAT local_90;
  Directory local_68;
  
  stream_00 = this->m_stream;
  if (*(int *)(stream_00 + *(long *)(*(long *)stream_00 + -0x18) + 0x20) == 0) {
    this_00 = &this->m_header;
    Header::load(this_00,stream_00);
    local_90.m_stream = this->m_stream;
    local_90.m_msat.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.m_msat.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.m_msat.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.m_header = this_00;
    MSAT::loadMSAT(&local_90);
    MSAT::buildSAT((SAT *)local_128,&local_90);
    pSVar4 = (this->m_sat).m_sat.
             super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar5 = (this->m_sat).m_sat.
             super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->m_sat).m_sat.
    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_128;
    (this->m_sat).m_sat.
    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
    super__Vector_impl_data._M_finish = pSStack_120;
    (this->m_sat).m_sat.
    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_118._M_allocated_capacity;
    local_128 = (undefined1  [8])0x0;
    pSStack_120 = (pointer)0x0;
    local_118._M_allocated_capacity = 0;
    if (pSVar4 != (pointer)0x0) {
      operator_delete(pSVar4,(long)pSVar5 - (long)pSVar4);
      if (local_128 != (undefined1  [8])0x0) {
        operator_delete((void *)local_128,local_118._M_allocated_capacity - (long)local_128);
      }
    }
    loadSSAT((SAT *)local_128,this_00,this->m_stream,&this->m_sat);
    pSVar4 = (this->m_ssat).m_sat.
             super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar5 = (this->m_ssat).m_sat.
             super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->m_ssat).m_sat.
    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_128;
    (this->m_ssat).m_sat.
    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
    super__Vector_impl_data._M_finish = pSStack_120;
    (this->m_ssat).m_sat.
    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_118._M_allocated_capacity;
    local_128 = (undefined1  [8])0x0;
    pSStack_120 = (pointer)0x0;
    local_118._M_allocated_capacity = 0;
    if (pSVar4 != (pointer)0x0) {
      operator_delete(pSVar4,(long)pSVar5 - (long)pSVar4);
      if (local_128 != (undefined1  [8])0x0) {
        operator_delete((void *)local_128,local_118._M_allocated_capacity - (long)local_128);
      }
    }
    local_1a0.m_name._M_dataplus._M_p._0_4_ = (this->m_header).m_dirStreamSecID.m_id;
    Stream::Stream((Stream *)local_128,this_00,&this->m_sat,(SecID *)&local_1a0,this->m_stream);
    paVar1 = &local_1a0.m_name.field_2;
    local_1a0.m_name._M_string_length = 0;
    local_1a0.m_name.field_2._M_local_buf[0] = L'\0';
    local_1a0.m_type = Empty;
    local_1a0.m_secID.m_id = -2;
    local_1a0.m_streamSize = 0;
    local_1a0.m_rightChild = -1;
    local_1a0.m_leftChild = -1;
    local_1a0.m_rootNode = -1;
    local_1a0.m_name._M_dataplus._M_p = (pointer)paVar1;
    Directory::load(&local_1a0,(Stream *)local_128);
    (this->m_shortStreamFirstSector).m_id = local_1a0.m_secID.m_id;
    Stream::seek((Stream *)local_128,local_1a0.m_rootNode << 7,FromBeginning);
    paVar2 = &local_160.m_name.field_2;
    local_160.m_name._M_string_length = 0;
    local_160.m_name.field_2._M_local_buf[0] = L'\0';
    local_160.m_type = Empty;
    local_160.m_secID.m_id = -2;
    local_160.m_streamSize = 0;
    local_160.m_rightChild = -1;
    local_160.m_leftChild = -1;
    local_160.m_rootNode = -1;
    local_160.m_name._M_dataplus._M_p = (pointer)paVar2;
    Directory::load(&local_160,(Stream *)local_128);
    local_164 = local_1a0.m_rootNode;
    pmVar7 = std::
             map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
             ::operator[](&this->m_dirs,&local_164);
    std::__cxx11::wstring::_M_assign((wstring *)pmVar7);
    pmVar7->m_leftChild = local_160.m_leftChild;
    pmVar7->m_rootNode = local_160.m_rootNode;
    pmVar7->m_type = local_160.m_type;
    (pmVar7->m_secID).m_id = local_160.m_secID.m_id;
    pmVar7->m_streamSize = local_160.m_streamSize;
    pmVar7->m_rightChild = local_160.m_rightChild;
    paVar3 = &local_68.m_name.field_2;
    local_68.m_name._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)&local_68,local_160.m_name._M_dataplus._M_p,
               local_160.m_name._M_dataplus._M_p + local_160.m_name._M_string_length);
    local_68.m_leftChild = local_160.m_leftChild;
    local_68.m_rootNode = local_160.m_rootNode;
    local_68.m_type = local_160.m_type;
    local_68.m_secID.m_id = local_160.m_secID.m_id;
    local_68.m_streamSize = local_160.m_streamSize;
    local_68.m_rightChild = local_160.m_rightChild;
    loadChildDirectories(&this->m_dirs,&local_68,(Stream *)local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_68.m_name._M_dataplus._M_p != paVar3) {
      operator_delete(local_68.m_name._M_dataplus._M_p,
                      local_68.m_name.field_2._M_allocated_capacity * 4 + 4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_160.m_name._M_dataplus._M_p != paVar2) {
      operator_delete(local_160.m_name._M_dataplus._M_p,
                      CONCAT44(local_160.m_name.field_2._M_local_buf[1],
                               local_160.m_name.field_2._M_local_buf[0]) * 4 + 4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_1a0.m_name._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a0.m_name._M_dataplus._M_p,
                      CONCAT44(local_1a0.m_name.field_2._M_local_buf[1],
                               local_1a0.m_name.field_2._M_local_buf[0]) * 4 + 4);
    }
    local_128 = (undefined1  [8])&PTR__Stream_00136ba0;
    if (local_b8 != (pointer)0x0) {
      operator_delete(local_b8,(long)local_a8 - (long)local_b8);
    }
    if (local_f8 != (pointer)0x0) {
      operator_delete(local_f8,(long)local_e8 - (long)local_f8);
    }
    if ((pointer)local_118._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_118._8_8_,(long)local_100 - local_118._8_8_);
    }
    if (local_90.m_msat.
        super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.m_msat.
                      super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.m_msat.
                            super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.m_msat.
                            super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x30);
  local_1a0.m_name._M_dataplus._M_p = (pointer)&local_1a0.m_name.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_1a0,L"Unable to open file : ",L"");
  pcVar6 = (fileName->_M_dataplus)._M_p;
  local_160.m_name._M_dataplus._M_p = (pointer)&local_160.m_name.field_2;
  std::__cxx11::wstring::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((wstring *)&local_160,pcVar6,pcVar6 + fileName->_M_string_length);
  std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_128,&local_1a0.m_name,&local_160.m_name);
  Exception::Exception(this_01,(wstring *)local_128);
  __cxa_throw(this_01,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void
File::initialize( const std::string & fileName )
{
	if( m_stream.good() )
	{
		m_header.load( m_stream );

		MSAT msat( m_header, m_stream );
		m_sat = msat.buildSAT();

		m_ssat = loadSSAT( m_header, m_stream, m_sat );

		Stream stream( m_header, m_sat, m_header.dirStreamSecID(), m_stream );

		Directory root;
		root.load( stream );

		m_shortStreamFirstSector = root.streamSecID();

		stream.seek( root.rootNode() * dirRecordSize, Stream::FromBeginning );

		Directory rootEntry;
		rootEntry.load( stream );

		m_dirs[ root.rootNode() ] = rootEntry;

		loadChildDirectories( m_dirs, rootEntry, stream );
	}
	else
		throw Exception( std::wstring( L"Unable to open file : " ) +
			std::wstring( fileName.cbegin(), fileName.cend() ) );
}